

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          uint32_t extra_array_length,NestedCompositeComponents *scalar_interface_vars)

{
  bool bVar1;
  DefUseManager *this_00;
  bool bVar2;
  uint local_11c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> interface_var_component_indices;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> users;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_to_component_values;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_to_composites;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_for_access_chain_to_composites;
  
  users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  users.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  loads_to_composites._M_h._M_bucket_count = 0;
  loads_to_composites._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:268:22)>
       ::_M_invoke;
  loads_to_composites._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/interface_var_sroa.cpp:268:22)>
       ::_M_manager;
  loads_to_composites._M_h._M_buckets = (__buckets_ptr)&users;
  analysis::DefUseManager::ForEachUser
            (this_00,interface_var,
             (function<void_(spvtools::opt::Instruction_*)> *)&loads_to_composites);
  if (loads_to_composites._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)loads_to_composites._M_h._M_before_begin._M_nxt)
              (&loads_to_composites,&loads_to_composites,3);
  }
  interface_var_component_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  interface_var_component_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  interface_var_component_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  loads_to_composites._M_h._M_buckets = &loads_to_composites._M_h._M_single_bucket;
  loads_to_composites._M_h._M_bucket_count = 1;
  loads_to_composites._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  loads_to_composites._M_h._M_element_count = 0;
  loads_to_composites._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  loads_to_composites._M_h._M_rehash_policy._M_next_resize = 0;
  loads_to_composites._M_h._M_single_bucket = (__node_base_ptr)0x0;
  loads_for_access_chain_to_composites._M_h._M_buckets =
       &loads_for_access_chain_to_composites._M_h._M_single_bucket;
  loads_for_access_chain_to_composites._M_h._M_bucket_count = 1;
  loads_for_access_chain_to_composites._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  loads_for_access_chain_to_composites._M_h._M_element_count = 0;
  loads_for_access_chain_to_composites._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  loads_for_access_chain_to_composites._M_h._M_rehash_policy._M_next_resize = 0;
  loads_for_access_chain_to_composites._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (extra_array_length == 0) {
    bVar2 = false;
    bVar1 = ReplaceComponentsOfInterfaceVarWith
                      (this,interface_var,&users,scalar_interface_vars,
                       &interface_var_component_indices,(uint32_t *)0x0,&loads_to_composites,
                       &loads_for_access_chain_to_composites);
    if (!bVar1) goto LAB_001fdbd1;
  }
  else {
    for (local_11c = 0; local_11c < extra_array_length; local_11c = local_11c + 1) {
      loads_to_component_values._M_h._M_bucket_count = 1;
      loads_to_component_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      loads_to_component_values._M_h._M_element_count = 0;
      loads_to_component_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      loads_to_component_values._M_h._M_rehash_policy._M_next_resize = 0;
      loads_to_component_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
      loads_to_component_values._M_h._M_buckets = &loads_to_component_values._M_h._M_single_bucket;
      bVar1 = ReplaceComponentsOfInterfaceVarWith
                        (this,interface_var,&users,scalar_interface_vars,
                         &interface_var_component_indices,&local_11c,
                         (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                          *)&loads_to_component_values._M_h,&loads_for_access_chain_to_composites);
      if (!bVar1) {
        std::
        _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&loads_to_component_values._M_h);
        bVar2 = false;
        goto LAB_001fdbd1;
      }
      AddComponentsToCompositesForLoads
                (this,(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                       *)&loads_to_component_values._M_h,&loads_to_composites,0);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&loads_to_component_values._M_h);
    }
  }
  anon_unknown_0::ReplaceLoadWithCompositeConstruct
            ((this->super_Pass).context_,&loads_to_composites);
  anon_unknown_0::ReplaceLoadWithCompositeConstruct
            ((this->super_Pass).context_,&loads_for_access_chain_to_composites);
  KillInstructionsAndUsers(this,&users);
  bVar2 = true;
LAB_001fdbd1:
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&loads_for_access_chain_to_composites._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&loads_to_composites._M_h);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&interface_var_component_indices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&users.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar2;
}

Assistant:

bool InterfaceVariableScalarReplacement::ReplaceInterfaceVarWith(
    Instruction* interface_var, uint32_t extra_array_length,
    const NestedCompositeComponents& scalar_interface_vars) {
  std::vector<Instruction*> users;
  context()->get_def_use_mgr()->ForEachUser(
      interface_var, [&users](Instruction* user) { users.push_back(user); });

  std::vector<uint32_t> interface_var_component_indices;
  std::unordered_map<Instruction*, Instruction*> loads_to_composites;
  std::unordered_map<Instruction*, Instruction*>
      loads_for_access_chain_to_composites;
  if (extra_array_length != 0) {
    // Note that the extra arrayness is the first dimension of the array
    // interface variable.
    for (uint32_t index = 0; index < extra_array_length; ++index) {
      std::unordered_map<Instruction*, Instruction*> loads_to_component_values;
      if (!ReplaceComponentsOfInterfaceVarWith(
              interface_var, users, scalar_interface_vars,
              interface_var_component_indices, &index,
              &loads_to_component_values,
              &loads_for_access_chain_to_composites)) {
        return false;
      }
      AddComponentsToCompositesForLoads(loads_to_component_values,
                                        &loads_to_composites, 0);
    }
  } else if (!ReplaceComponentsOfInterfaceVarWith(
                 interface_var, users, scalar_interface_vars,
                 interface_var_component_indices, nullptr, &loads_to_composites,
                 &loads_for_access_chain_to_composites)) {
    return false;
  }

  ReplaceLoadWithCompositeConstruct(context(), loads_to_composites);
  ReplaceLoadWithCompositeConstruct(context(),
                                    loads_for_access_chain_to_composites);

  KillInstructionsAndUsers(users);
  return true;
}